

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O3

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,VarValue *value)

{
  ostringstream *this_00;
  DataType dataType;
  MessageBuilder *pMVar1;
  DataType DVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *stream;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  Hex<8UL> local_50;
  uint local_48;
  float local_44;
  MessageBuilder *local_40;
  ulong local_38;
  
  this_00 = &this->m_str;
  dataType = (value->type->m_data).basic.type;
  DVar2 = glu::getDataTypeScalarType(dataType);
  uVar3 = glu::getDataTypeScalarSize(dataType);
  if ((int)uVar3 < 2) {
    if (uVar3 != 1) {
      return this;
    }
  }
  else {
    pcVar4 = glu::getDataTypeName(dataType);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
  }
  uVar6 = (ulong)uVar3;
  uVar7 = 0;
  local_48 = uVar3;
  local_40 = this;
  local_38 = uVar6;
  do {
    if (uVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    }
    if ((int)DVar2 < 0x1f) {
      if (DVar2 == TYPE_FLOAT) {
        local_44 = *(float *)((long)value->value + uVar7 * 4);
        stream = std::ostream::_M_insert<double>((double)local_44);
        std::__ostream_insert<char,std::char_traits<char>>(stream," / ",3);
        uVar6 = local_38;
        local_50.value._0_4_ = local_44;
LAB_0047890b:
        local_50.value._4_4_ = 0;
        Format::Hex<8UL>::toStream(&local_50,stream);
      }
      else if (DVar2 == TYPE_INT) {
        std::ostream::operator<<(this_00,*(int *)((long)value->value + uVar7 * 4));
      }
    }
    else {
      if (DVar2 == TYPE_UINT) {
        local_50.value._0_4_ = *(float *)((long)value->value + uVar7 * 4);
        stream = (ostream *)this_00;
        goto LAB_0047890b;
      }
      if (DVar2 == TYPE_BOOL) {
        bVar8 = *(int *)((long)value->value + uVar7 * 4) == 0;
        pcVar4 = "true";
        if (bVar8) {
          pcVar4 = "false";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,pcVar4,(ulong)bVar8 | 4);
      }
    }
    pMVar1 = local_40;
    uVar7 = uVar7 + 1;
    if (uVar6 == uVar7) {
      if (1 < (int)local_48) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      }
      return pMVar1;
    }
  } while( true );
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}